

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_cmd.cpp
# Opt level: O0

void __thiscall NshCmdCopy_Success_Test::TestBody(NshCmdCopy_Success_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_128;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_5;
  Message local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_4;
  Message local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_3;
  Message local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_2;
  Message local_a0;
  nsh_status local_98;
  nsh_status_t local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  nsh_cmd_t cmd_to;
  AssertHelper local_60;
  Message local_58 [3];
  nsh_status local_40;
  nsh_status_t local_3c;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  nsh_cmd_t cmd_from;
  NshCmdCopy_Success_Test *this_local;
  
  cmd_from.name._8_8_ = this;
  local_3c = nsh_cmd_init((nsh_cmd_t *)&gtest_ar.message_,"test",cmd_test_handler);
  local_40 = NSH_STATUS_OK;
  testing::internal::EqHelper::Compare<nsh_status,_nsh_status,_nullptr>
            ((EqHelper *)local_38,"nsh_cmd_init(&cmd_from, cmd_test_name, &cmd_test_handler)",
             "NSH_STATUS_OK",&local_3c,&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(local_58);
  }
  cmd_to.name[0xd] = '\0';
  cmd_to.name[0xe] = '\0';
  cmd_to.name[0xf] = '\0';
  cmd_to.name[0xc] = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (cmd_to.name._12_4_ == 0) {
    local_94 = nsh_cmd_init_empty((nsh_cmd_t *)&gtest_ar_1.message_);
    local_98 = NSH_STATUS_OK;
    testing::internal::EqHelper::Compare<nsh_status,_nsh_status,_nullptr>
              ((EqHelper *)local_90,"nsh_cmd_init_empty(&cmd_to)","NSH_STATUS_OK",&local_94,
               &local_98);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_a0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd.cpp"
                 ,0x47,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_a0);
    }
    cmd_to.name[0xd] = '\0';
    cmd_to.name[0xe] = '\0';
    cmd_to.name[0xf] = '\0';
    cmd_to.name[0xc] = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    if (cmd_to.name._12_4_ == 0) {
      testing::internal::CmpHelperSTRNE
                ((internal *)local_b8,"cmd_to.name","cmd_from.name",(char *)&cmd_to,
                 (char *)&cmd_from);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
      if (!bVar1) {
        testing::Message::Message(&local_c0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd.cpp"
                   ,0x49,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_c0);
      }
      cmd_to.name[0xd] = '\0';
      cmd_to.name[0xe] = '\0';
      cmd_to.name[0xf] = '\0';
      cmd_to.name[0xc] = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
      if (cmd_to.name._12_4_ == 0) {
        testing::internal::
        CmpHelperNE<nsh_status(*)(unsigned_int,char**),nsh_status(*)(unsigned_int,char**)>
                  ((internal *)local_d8,"cmd_to.handler","cmd_from.handler",
                   (_func_nsh_status_uint_char_ptr_ptr **)&gtest_ar_1.message_,
                   (_func_nsh_status_uint_char_ptr_ptr **)&gtest_ar.message_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
        if (!bVar1) {
          testing::Message::Message(&local_e0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd.cpp"
                     ,0x4a,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_e0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_e0);
        }
        cmd_to.name[0xd] = '\0';
        cmd_to.name[0xe] = '\0';
        cmd_to.name[0xf] = '\0';
        cmd_to.name[0xc] = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
        if (cmd_to.name._12_4_ == 0) {
          nsh_cmd_copy((nsh_cmd_t *)&gtest_ar_1.message_,(nsh_cmd_t *)&gtest_ar.message_);
          testing::internal::CmpHelperSTREQ
                    ((internal *)local_f8,"cmd_to.name","cmd_from.name",(char *)&cmd_to,
                     (char *)&cmd_from);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
          if (!bVar1) {
            testing::Message::Message(&local_100);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd.cpp"
                       ,0x4e,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_100);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_100);
          }
          cmd_to.name[0xd] = '\0';
          cmd_to.name[0xe] = '\0';
          cmd_to.name[0xf] = '\0';
          cmd_to.name[0xc] = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
          if (cmd_to.name._12_4_ == 0) {
            testing::internal::EqHelper::
            Compare<nsh_status_(*)(unsigned_int,_char_**),_nsh_status_(*)(unsigned_int,_char_**),_nullptr>
                      ((EqHelper *)local_118,"cmd_to.handler","cmd_from.handler",
                       (_func_nsh_status_uint_char_ptr_ptr **)&gtest_ar_1.message_,
                       (_func_nsh_status_uint_char_ptr_ptr **)&gtest_ar.message_);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
            if (!bVar1) {
              testing::Message::Message(&local_120);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
              testing::internal::AssertHelper::AssertHelper
                        (&local_128,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd.cpp"
                         ,0x4f,pcVar2);
              testing::internal::AssertHelper::operator=(&local_128,&local_120);
              testing::internal::AssertHelper::~AssertHelper(&local_128);
              testing::Message::~Message(&local_120);
            }
            cmd_to.name[0xd] = '\0';
            cmd_to.name[0xe] = '\0';
            cmd_to.name[0xf] = '\0';
            cmd_to.name[0xc] = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(NshCmdCopy, Success)
{
    nsh_cmd_t cmd_from;
    ASSERT_EQ(nsh_cmd_init(&cmd_from, cmd_test_name, &cmd_test_handler), NSH_STATUS_OK);

    nsh_cmd_t cmd_to;
    ASSERT_EQ(nsh_cmd_init_empty(&cmd_to), NSH_STATUS_OK);

    ASSERT_STRNE(cmd_to.name, cmd_from.name);
    ASSERT_NE(cmd_to.handler, cmd_from.handler);

    nsh_cmd_copy(&cmd_to, &cmd_from);

    ASSERT_STREQ(cmd_to.name, cmd_from.name);
    ASSERT_EQ(cmd_to.handler, cmd_from.handler);
}